

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_destroy_decompress(opj_dinfo_t *dinfo)

{
  uint uVar1;
  void *in_RDI;
  opj_j2k_t *unaff_retaddr;
  
  if (in_RDI != (void *)0x0) {
    uVar1 = *(uint *)((long)in_RDI + 0x14);
    if (uVar1 != 0xffffffff) {
      if (uVar1 < 2) {
        j2k_destroy_decompress(unaff_retaddr);
      }
      else if (uVar1 == 2) {
        jp2_destroy_decompress((opj_jp2_t *)0x2a8768);
      }
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_decompress(opj_dinfo_t *dinfo) {
	if(dinfo) {
		/* destroy the codec */
		switch(dinfo->codec_format) {
			case CODEC_J2K:
			case CODEC_JPT:
				j2k_destroy_decompress((opj_j2k_t*)dinfo->j2k_handle);
				break;
			case CODEC_JP2:
				jp2_destroy_decompress((opj_jp2_t*)dinfo->jp2_handle);
				break;
			case CODEC_UNKNOWN:
			default:
				break;
		}
		/* destroy the decompressor */
		opj_free(dinfo);
	}
}